

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O2

void __thiscall duckdb::DbpEncoder::WriteBlock(DbpEncoder *this,WriteStream *writer)

{
  bitpacking_width_t *pbVar1;
  data_t *dst;
  bitpacking_width_t bVar2;
  long lVar3;
  int64_t *piVar4;
  idx_t miniblock_idx;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int64_t iVar8;
  idx_t miniblock_idx_1;
  int64_t *src;
  
  uVar6 = this->block_count + 0xff >> 8;
  src = this->data;
  lVar3 = 0;
  piVar4 = src;
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      if ((ulong)(lVar3 + lVar7) < this->block_count) {
        iVar8 = piVar4[lVar7] - this->min_delta;
      }
      else {
        iVar8 = 0;
      }
      piVar4[lVar7] = iVar8;
    }
    lVar3 = lVar3 + 0x100;
    piVar4 = piVar4 + 0x100;
  }
  pbVar1 = this->list_of_bitwidths_of_miniblocks;
  piVar4 = src;
  for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
    if (uVar5 < uVar6) {
      bVar2 = BitpackingPrimitives::FindMinimumBitWidth<unsigned_long,false,false>
                        ((unsigned_long *)piVar4,0x100);
    }
    else {
      bVar2 = '\0';
    }
    pbVar1[uVar5] = bVar2;
    piVar4 = piVar4 + 0x100;
  }
  ParquetDecodeUtils::VarintEncode<unsigned_long>
            (this->min_delta >> 0x3f ^ this->min_delta * 2,writer);
  (**writer->_vptr_WriteStream)(writer,pbVar1,8);
  dst = this->data_packed;
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    switchD_0049f7f1::default(dst,0,0x800);
    BitpackingPrimitives::PackBuffer<unsigned_long,true>
              (dst,(unsigned_long *)src,0x100,pbVar1[uVar5]);
    (**writer->_vptr_WriteStream)(writer,dst,(ulong)pbVar1[uVar5] << 5);
    src = src + 0x100;
  }
  this->count = this->count + this->block_count;
  this->min_delta = 0x7fffffffffffffff;
  this->block_count = 0;
  return;
}

Assistant:

void WriteBlock(WriteStream &writer) {
		D_ASSERT(count + block_count == total_value_count || block_count == BLOCK_SIZE_IN_VALUES);
		const auto number_of_miniblocks =
		    (block_count + NUMBER_OF_VALUES_IN_A_MINIBLOCK - 1) / NUMBER_OF_VALUES_IN_A_MINIBLOCK;
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				const idx_t index = miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK + i;
				auto &value = data[index];
				if (index < block_count) {
					// 2. Compute the frame of reference (the minimum of the deltas in the block).
					// Subtract this min delta from all deltas in the block.
					// This guarantees that all values are non-negative.
					D_ASSERT(min_delta <= value);
					value = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(min_delta));
				} else {
					// If there are not enough values to fill the last miniblock, we pad the miniblock
					// so that its length is always the number of values in a full miniblock multiplied by the bit
					// width. The values of the padding bits should be zero, but readers must accept paddings consisting
					// of arbitrary bits as well.
					value = 0;
				}
			}
		}

		for (idx_t miniblock_idx = 0; miniblock_idx < NUMBER_OF_MINIBLOCKS_IN_A_BLOCK; miniblock_idx++) {
			auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			if (miniblock_idx < number_of_miniblocks) {
				const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
				width = BitpackingPrimitives::MinimumBitWidth(reinterpret_cast<uint64_t *>(src),
				                                              NUMBER_OF_VALUES_IN_A_MINIBLOCK);
				D_ASSERT(width <= sizeof(int64_t) * 8);
			} else {
				// If, in the last block, less than <number of miniblocks in a block> miniblocks are needed to store the
				// values, the bytes storing the bit widths of the unneeded miniblocks are still present, their value
				// should be zero, but readers must accept arbitrary values as well. There are no additional padding
				// bytes for the miniblock bodies though, as if their bit widths were 0 (regardless of the actual byte
				// values). The reader knows when to stop reading by keeping track of the number of values read.
				width = 0;
			}
		}

		// 3. Encode the frame of reference (min delta) as a zigzag ULEB128 int
		// followed by the bit widths of the miniblocks
		// and the delta values (minus the min delta) bit-packed per miniblock.
		// <min delta> <list of bitwidths of miniblocks> <miniblocks>

		// the min delta is a zigzag ULEB128 int (we compute a minimum as we need positive integers for bit packing)
		ParquetDecodeUtils::VarintEncode(ParquetDecodeUtils::IntToZigzag(min_delta), writer);
		// the bitwidth of each block is stored as a byte
		writer.WriteData(list_of_bitwidths_of_miniblocks, NUMBER_OF_MINIBLOCKS_IN_A_BLOCK);
		// each miniblock is a list of bit packed ints according to the bit width stored at the beginning of the block
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			const auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			memset(data_packed, 0, sizeof(data_packed));
			ParquetDecodeUtils::BitPackAligned(reinterpret_cast<uint64_t *>(src), data_packed,
			                                   NUMBER_OF_VALUES_IN_A_MINIBLOCK, width);
			const auto write_size = NUMBER_OF_VALUES_IN_A_MINIBLOCK * width / 8;
#ifdef DEBUG
			// immediately verify that unpacking yields the input data
			int64_t verification_data[NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			ByteBuffer byte_buffer(data_ptr_cast(data_packed), write_size);
			bitpacking_width_t bitpack_pos = 0;
			ParquetDecodeUtils::BitUnpack(byte_buffer, bitpack_pos, verification_data, NUMBER_OF_VALUES_IN_A_MINIBLOCK,
			                              width);
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				D_ASSERT(src[i] == verification_data[i]);
			}
#endif
			writer.WriteData(data_packed, write_size);
		}

		count += block_count;

		min_delta = NumericLimits<int64_t>::Maximum();
		block_count = 0;
	}